

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

void eastl::swap<char*>(char **a,char **b)

{
  char *pcVar1;
  char *temp;
  char **b_local;
  char **a_local;
  
  pcVar1 = *a;
  *a = *b;
  *b = pcVar1;
  return;
}

Assistant:

inline void swap(T& a, T& b)
    {
#ifdef EA_COMPILER_HAS_MOVE_SEMANTICS
        T temp = std::move(a);
        a = std::move(b);
        b = std::move(temp);
#else
        T temp(a);
        a = b;
        b = temp;
#endif
    }